

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

float Rml::GetScrollOffsetDelta(ScrollAlignment alignment,float begin_offset,float end_offset)

{
  switch(alignment) {
  case Start:
    break;
  case Center:
    begin_offset = (begin_offset + end_offset) * 0.5;
    break;
  case End:
    return end_offset;
  case Nearest:
    if ((0.0 <= begin_offset) && (end_offset <= 0.0)) {
      return 0.0;
    }
    if ((0.0 <= begin_offset) || (0.0 <= end_offset)) {
      if (begin_offset <= 0.0) {
        return 0.0;
      }
      if (end_offset <= 0.0) {
        return 0.0;
      }
      if (end_offset <= begin_offset) {
        begin_offset = end_offset;
      }
    }
    else if (begin_offset <= end_offset) {
      begin_offset = end_offset;
    }
    break;
  default:
    return 0.0;
  }
  return begin_offset;
}

Assistant:

static float GetScrollOffsetDelta(ScrollAlignment alignment, float begin_offset, float end_offset)
{
	switch (alignment)
	{
	case ScrollAlignment::Start: return begin_offset;
	case ScrollAlignment::Center: return (begin_offset + end_offset) / 2.0f;
	case ScrollAlignment::End: return end_offset;
	case ScrollAlignment::Nearest:
		if (begin_offset >= 0.f && end_offset <= 0.f)
			return 0.f; // Element is already visible, don't scroll
		else if (begin_offset < 0.f && end_offset < 0.f)
			return Math::Max(begin_offset, end_offset);
		else if (begin_offset > 0.f && end_offset > 0.f)
			return Math::Min(begin_offset, end_offset);
		else
			return 0.f; // Shouldn't happen
	}
	return 0.f;
}